

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gc_heap.cpp
# Opt level: O0

void __thiscall mjs::gc_heap::gc_heap(gc_heap *this,uint32_t capacity)

{
  void *s;
  slot *psVar1;
  runtime_error *this_00;
  string local_88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  uint local_14;
  gc_heap *pgStack_10;
  uint32_t capacity_local;
  gc_heap *this_local;
  
  local_14 = capacity;
  pgStack_10 = this;
  pointer_set::pointer_set(&this->pointers_);
  s = malloc((ulong)local_14 << 3);
  allocation_context::allocation_context(&this->alloc_context_,s,local_14);
  this->owns_storage_ = true;
  gc_state::gc_state(&this->gc_state_);
  psVar1 = allocation_context::storage(&this->alloc_context_);
  if (psVar1 == (slot *)0x0) {
    this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::to_string(&local_88,local_14);
    std::operator+(&local_68,"Could not allocate heap for ",&local_88);
    std::operator+(&local_48,&local_68," slots");
    std::runtime_error::runtime_error(this_00,(string *)&local_48);
    __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  return;
}

Assistant:

gc_heap::gc_heap(uint32_t capacity) : alloc_context_(std::malloc(capacity * sizeof(slot)), capacity), owns_storage_(true) {
    if (!alloc_context_.storage()) {
        throw std::runtime_error("Could not allocate heap for " + std::to_string(capacity) + " slots");
    }
}